

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_boolean_abi_cxx11_
          (result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  bool bVar1;
  type rollback;
  value_type *pvVar2;
  internal_error *this_00;
  pair<bool,_toml::detail::region> *v;
  pair<bool,_toml::detail::region> *v_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_01;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_620;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_598;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_572;
  undefined1 local_571;
  source_location local_570;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_520;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_518;
  iterator local_4a8;
  size_type local_4a0;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_498;
  allocator<char> local_479;
  string local_478;
  string local_458;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_438;
  char *local_418;
  undefined1 local_409;
  source_location local_408;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_392;
  undefined1 local_391;
  source_location local_390;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_340;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_338;
  iterator local_2c8;
  size_type local_2c0;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8;
  allocator<char> local_299;
  string local_298;
  string local_278;
  bool local_251;
  pair<bool,_toml::detail::region> local_250;
  success<std::pair<bool,_toml::detail::region>_> local_200;
  string local_1b0;
  int local_190;
  bool local_189;
  pair<bool,_toml::detail::region> local_188;
  success<std::pair<bool,_toml::detail::region>_> local_138;
  string local_e8;
  undefined1 local_b8 [8];
  value_type reg;
  result<toml::detail::region,_toml::detail::none_t> token;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first;
  location *loc_local;
  
  rollback = location::iter((location *)this);
  either<toml::detail::sequence<toml::detail::character<'t'>,_toml::detail::character<'r'>,_toml::detail::character<'u'>,_toml::detail::character<'e'>_>,_toml::detail::sequence<toml::detail::character<'f'>,_toml::detail::character<'a'>,_toml::detail::character<'l'>,_toml::detail::character<'s'>,_toml::detail::character<'e'>_>_>
  ::invoke((result<toml::detail::region,_toml::detail::none_t> *)&reg.last_,(location *)this);
  bVar1 = toml::result::operator_cast_to_bool((result *)&reg.last_);
  if (bVar1) {
    pvVar2 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                       ((result<toml::detail::region,_toml::detail::none_t> *)&reg.last_);
    region::region((region *)local_b8,pvVar2);
    region::str_abi_cxx11_(&local_e8,(region *)local_b8);
    bVar1 = std::operator==(&local_e8,"true");
    std::__cxx11::string::~string((string *)&local_e8);
    if (bVar1) {
      local_189 = true;
      std::make_pair<bool,toml::detail::region_const&>(&local_188,&local_189,(region *)local_b8);
      ok<std::pair<bool,toml::detail::region>>(&local_138,(toml *)&local_188,v);
      result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_138);
      success<std::pair<bool,_toml::detail::region>_>::~success(&local_138);
      std::pair<bool,_toml::detail::region>::~pair(&local_188);
    }
    else {
      region::str_abi_cxx11_(&local_1b0,(region *)local_b8);
      bVar1 = std::operator==(&local_1b0,"false");
      std::__cxx11::string::~string((string *)&local_1b0);
      if (!bVar1) {
        local_409 = 1;
        this_00 = (internal_error *)__cxa_allocate_exception(0x78);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_298,"toml::parse_boolean: internal error",&local_299);
        local_391 = 1;
        local_340 = &local_338;
        source_location::source_location(&local_390,(region *)local_b8);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[14],_true>
                  (&local_338,&local_390,(char (*) [14])0x2f9061);
        local_391 = 0;
        local_2c8 = &local_338;
        local_2c0 = 1;
        std::
        allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator(&local_392);
        __l_00._M_len = local_2c0;
        __l_00._M_array = local_2c8;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector(&local_2b8,__l_00,&local_392);
        local_3b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_3b8);
        format_underline(&local_278,&local_298,&local_2b8,&local_3b8,false);
        source_location::source_location(&local_408,(region *)local_b8);
        internal_error::internal_error(this_00,&local_278,&local_408);
        local_409 = 0;
        __cxa_throw(this_00,&internal_error::typeinfo,internal_error::~internal_error);
      }
      local_251 = false;
      std::make_pair<bool,toml::detail::region_const&>(&local_250,&local_251,(region *)local_b8);
      ok<std::pair<bool,toml::detail::region>>(&local_200,(toml *)&local_250,v_00);
      result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_200);
      success<std::pair<bool,_toml::detail::region>_>::~success(&local_200);
      std::pair<bool,_toml::detail::region>::~pair(&local_250);
    }
    local_190 = 1;
    region::~region((region *)local_b8);
    if (local_190 != 0) goto LAB_00168c02;
  }
  local_190 = 0;
LAB_00168c02:
  result<toml::detail::region,_toml::detail::none_t>::~result
            ((result<toml::detail::region,_toml::detail::none_t> *)&reg.last_);
  if (local_190 == 0) {
    local_418 = rollback._M_current;
    location::reset((location *)this,(const_iterator)rollback._M_current);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,"toml::parse_boolean: ",&local_479);
    local_571 = 1;
    local_520 = &local_518;
    source_location::source_location(&local_570,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[32],_true>
              (&local_518,&local_570,(char (*) [32])"the next token is not a boolean");
    local_571 = 0;
    local_4a8 = &local_518;
    local_4a0 = 1;
    std::
    allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator(&local_572);
    __l._M_len = local_4a0;
    __l._M_array = local_4a8;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_498,__l,&local_572);
    local_598.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_598.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_598.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_598);
    format_underline(&local_458,&local_478,&local_498,&local_598,false);
    err<std::__cxx11::string>(&local_438,(toml *)&local_458,v_01);
    result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_438);
    failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~failure(&local_438);
    std::__cxx11::string::~string((string *)&local_458);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_598);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_498);
    std::
    allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator(&local_572);
    local_620 = (pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_4a8;
    do {
      local_620 = local_620 + -1;
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_620);
    } while (local_620 != &local_518);
    source_location::~source_location(&local_570);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator(&local_479);
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<boolean, region>, std::string>
parse_boolean(location& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_boolean::invoke(loc))
    {
        const auto reg = token.unwrap();
        if     (reg.str() == "true")  {return ok(std::make_pair(true,  reg));}
        else if(reg.str() == "false") {return ok(std::make_pair(false, reg));}
        else // internal error.
        {
            throw internal_error(format_underline(
                "toml::parse_boolean: internal error",
                {{source_location(reg), "invalid token"}}),
                source_location(reg));
        }
    }
    loc.reset(first); //rollback
    return err(format_underline("toml::parse_boolean: ",
               {{source_location(loc), "the next token is not a boolean"}}));
}